

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

void wasm::Literal::printFloat(ostream *o,float f)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  char *pcVar4;
  ostream *poVar5;
  void *pvVar6;
  uint32_t payload;
  char *sign;
  float f_local;
  ostream *o_local;
  
  uVar2 = std::isnan((double)(ulong)(uint)f);
  if ((uVar2 & 1) == 0) {
    printDouble(o,(double)f);
  }
  else {
    bVar1 = std::signbit(f);
    pcVar4 = "";
    if (bVar1) {
      pcVar4 = "-";
    }
    poVar5 = std::operator<<(o,pcVar4);
    std::operator<<(poVar5,"nan");
    uVar3 = NaNPayload(f);
    if (uVar3 != 0) {
      poVar5 = std::operator<<(o,":0x");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,uVar3);
      std::ostream::operator<<(pvVar6,std::dec);
    }
  }
  return;
}

Assistant:

void Literal::printFloat(std::ostream& o, float f) {
  if (std::isnan(f)) {
    const char* sign = std::signbit(f) ? "-" : "";
    o << sign << "nan";
    if (uint32_t payload = NaNPayload(f)) {
      o << ":0x" << std::hex << payload << std::dec;
    }
    return;
  }
  printDouble(o, f);
}